

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O3

int run_test_tcp_write_ready(void)

{
  uv_stream_t *puVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong unaff_RBX;
  int iVar5;
  uv_connect_t *puVar6;
  long *plVar7;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  long alStack_50 [2];
  undefined1 auStack_40 [16];
  code *pcStack_30;
  void *local_28;
  void *local_20;
  
  iVar5 = (int)&local_28;
  pcStack_30 = (code *)0x1cda80;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&stack0xffffffffffffffe8);
  local_20 = (void *)(long)iVar2;
  local_28 = (void *)0x0;
  if (local_20 == (void *)0x0) {
    pcStack_30 = (code *)0x1cdaa3;
    uVar3 = create_tcp_socket();
    unaff_RBX = (ulong)uVar3;
    pcStack_30 = (code *)0x1cdaaa;
    uVar4 = uv_default_loop();
    pcStack_30 = (code *)0x1cdab9;
    iVar2 = uv_tcp_init(uVar4,&client);
    local_20 = (void *)(long)iVar2;
    local_28 = (void *)0x0;
    if (local_20 != (void *)0x0) goto LAB_001cdc66;
    pcStack_30 = (code *)0x1cdae5;
    iVar2 = uv_tcp_open(&client,uVar3);
    local_20 = (void *)(long)iVar2;
    local_28 = (void *)0x0;
    if (local_20 != (void *)0x0) goto LAB_001cdc73;
    pcStack_30 = (code *)0x1cdb22;
    iVar2 = uv_tcp_connect(&connect_req,&client,&stack0xffffffffffffffe8,connect1_cb);
    local_20 = (void *)(long)iVar2;
    local_28 = (void *)0x0;
    if (local_20 != (void *)0x0) goto LAB_001cdc80;
    pcStack_30 = (code *)0x1cdb45;
    uVar4 = uv_default_loop();
    pcStack_30 = (code *)0x1cdb4f;
    uv_run(uVar4,0);
    local_20 = (void *)0x1;
    local_28 = (void *)(long)shutdown_cb_called;
    if (local_28 != (void *)0x1) goto LAB_001cdc8d;
    local_20 = (void *)0x1;
    local_28 = (void *)(long)shutdown_requested;
    if (local_28 != (void *)0x1) goto LAB_001cdc9a;
    local_20 = (void *)0x1;
    local_28 = (void *)(long)connect_cb_called;
    if (local_28 != (void *)0x1) goto LAB_001cdca7;
    local_20 = (void *)(long)write_cb_called;
    local_28 = (void *)0x0;
    if ((long)local_20 < 1) goto LAB_001cdcb4;
    local_20 = (void *)0x1;
    local_28 = (void *)(long)close_cb_called;
    if (local_28 != (void *)0x1) goto LAB_001cdcc1;
    pcStack_30 = (code *)0x1cdc03;
    unaff_RBX = uv_default_loop();
    pcStack_30 = (code *)0x1cdc17;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_30 = (code *)0x1cdc21;
    uv_run(unaff_RBX,0);
    local_20 = (void *)0x0;
    pcStack_30 = (code *)0x1cdc2f;
    uVar4 = uv_default_loop();
    pcStack_30 = (code *)0x1cdc37;
    iVar2 = uv_loop_close(uVar4);
    local_28 = (void *)(long)iVar2;
    if (local_20 == local_28) {
      pcStack_30 = (code *)0x1cdc51;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_30 = (code *)0x1cdc66;
    run_test_tcp_write_ready_cold_1();
LAB_001cdc66:
    pcStack_30 = (code *)0x1cdc73;
    run_test_tcp_write_ready_cold_2();
LAB_001cdc73:
    pcStack_30 = (code *)0x1cdc80;
    run_test_tcp_write_ready_cold_3();
LAB_001cdc80:
    pcStack_30 = (code *)0x1cdc8d;
    run_test_tcp_write_ready_cold_4();
LAB_001cdc8d:
    pcStack_30 = (code *)0x1cdc9a;
    run_test_tcp_write_ready_cold_5();
LAB_001cdc9a:
    pcStack_30 = (code *)0x1cdca7;
    run_test_tcp_write_ready_cold_6();
LAB_001cdca7:
    pcStack_30 = (code *)0x1cdcb4;
    run_test_tcp_write_ready_cold_7();
LAB_001cdcb4:
    pcStack_30 = (code *)0x1cdcc1;
    run_test_tcp_write_ready_cold_8();
LAB_001cdcc1:
    pcStack_30 = (code *)0x1cdcce;
    run_test_tcp_write_ready_cold_9();
  }
  puVar6 = (uv_connect_t *)&stack0xffffffffffffffe0;
  pcStack_30 = connect1_cb;
  run_test_tcp_write_ready_cold_10();
  puVar1 = connect_req.handle;
  plVar7 = alStack_50;
  pcStack_30 = (code *)unaff_RBX;
  if (puVar6 == &connect_req) {
    auStack_40._0_8_ = SEXT48(iVar5);
    alStack_50[0] = 0;
    if (auStack_40._0_8_ != 0) goto LAB_001cde16;
    connect_cb_called = connect_cb_called + 1;
    uVar4 = uv_default_loop();
    iVar2 = uv_timer_init(uVar4,&tm);
    auStack_40._0_8_ = SEXT48(iVar2);
    alStack_50[0] = 0;
    if (auStack_40._0_8_ != 0) goto LAB_001cde23;
    iVar2 = uv_timer_start(&tm,timer_cb,2000,0);
    auStack_40._0_8_ = SEXT48(iVar2);
    alStack_50[0] = 0;
    if (auStack_40._0_8_ != 0) goto LAB_001cde30;
    auStack_40 = uv_buf_init("P",1);
    iVar2 = uv_write(&write_req,puVar1,auStack_40,1,write1_cb);
    alStack_50[0] = (long)iVar2;
    alStack_50[1] = 0;
    if (alStack_50[0] == 0) {
      iVar2 = uv_read_start(puVar1,alloc_cb,read1_cb);
      alStack_50[0] = (long)iVar2;
      alStack_50[1] = 0;
      if (alStack_50[0] == 0) {
        return iVar2;
      }
      goto LAB_001cde4a;
    }
  }
  else {
    connect1_cb_cold_1();
LAB_001cde16:
    connect1_cb_cold_2();
LAB_001cde23:
    connect1_cb_cold_3();
LAB_001cde30:
    connect1_cb_cold_4();
  }
  connect1_cb_cold_5();
LAB_001cde4a:
  connect1_cb_cold_6();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(plVar7,0);
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_write_ready) {
  struct sockaddr_in addr;
  uv_os_sock_t sock;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_tcp_socket();

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_tcp_open(&client, sock);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &client,
                     (const struct sockaddr*) &addr,
                     connect1_cb);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, shutdown_cb_called);
  ASSERT_EQ(1, shutdown_requested);
  ASSERT_EQ(1, connect_cb_called);
  ASSERT_GT(write_cb_called, 0);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}